

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxequilisc.hpp
# Opt level: O2

number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
maxPrescaledRatio<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
          (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *__return_storage_ptr__,soplex *this,
          SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *lp,vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              *coScaleval,bool rowRatio)

{
  undefined8 *puVar1;
  long lVar2;
  Real eps;
  type_conflict5 tVar3;
  double *pdVar4;
  soplex *psVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *extraout_RDX;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *extraout_RDX_00;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *extraout_RDX_01;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *arg;
  long lVar9;
  long lVar10;
  long *plVar11;
  ulong uVar12;
  bool bVar13;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  p;
  cpp_dec_float<50U,_int,_void> local_168;
  cpp_dec_float<50U,_int,_void> local_128;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_e8;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined4 local_80;
  undefined1 local_7c;
  undefined8 local_78;
  Tolerances *local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60 [6];
  
  uVar12 = 0;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            (&__return_storage_ptr__->m_backend,0.0,(type *)0x0);
  bVar13 = (int)coScaleval != 0;
  psVar5 = this + 0x100;
  if (bVar13) {
    psVar5 = this + 0x38;
  }
  lVar7 = 0xe8;
  if (bVar13) {
    lVar7 = 0x20;
  }
  lVar8 = 0xf0;
  if (bVar13) {
    lVar8 = 0x28;
  }
  uVar6 = (ulong)*(uint *)psVar5;
  if ((int)*(uint *)psVar5 < 1) {
    uVar6 = uVar12;
  }
  for (; uVar12 != uVar6; uVar12 = uVar12 + 1) {
    plVar11 = (long *)((long)*(int *)(*(long *)(this + lVar8) + 4 + uVar12 * 8) * 0x28 +
                      *(long *)(this + lVar7));
    pdVar4 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              (&local_168,*pdVar4,(type *)0x0);
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              (&local_128,0.0,(type *)0x0);
    lVar9 = 0;
    arg = extraout_RDX;
    for (lVar10 = 0; lVar10 < *(int *)((long)plVar11 + 0xc); lVar10 = lVar10 + 1) {
      lVar2 = *plVar11;
      local_88 = *(undefined8 *)(lVar2 + 0x20 + lVar9);
      local_a8 = *(undefined8 *)(lVar2 + lVar9);
      uStack_a0 = ((undefined8 *)(lVar2 + lVar9))[1];
      puVar1 = (undefined8 *)(lVar2 + 0x10 + lVar9);
      local_98 = *puVar1;
      uStack_90 = puVar1[1];
      local_80 = *(undefined4 *)(lVar2 + 0x28 + lVar9);
      local_7c = *(undefined1 *)(lVar2 + 0x2c + lVar9);
      local_78 = *(undefined8 *)(lVar2 + 0x30 + lVar9);
      boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                ((type *)&local_68,(multiprecision *)&local_a8,arg);
      p.m_backend.fpclass = cpp_dec_float_finite;
      p.m_backend.prec_elem = 10;
      p.m_backend.data._M_elems[0] = 0;
      p.m_backend.data._M_elems[1] = 0;
      p.m_backend.data._M_elems[2] = 0;
      p.m_backend.data._M_elems[3] = 0;
      p.m_backend.data._M_elems[4] = 0;
      p.m_backend.data._M_elems[5] = 0;
      p.m_backend.data._M_elems._24_5_ = 0;
      p.m_backend.data._M_elems[7]._1_3_ = 0;
      p.m_backend.data._M_elems._32_5_ = 0;
      p.m_backend.data._M_elems[9]._1_3_ = 0;
      p.m_backend.exp = 0;
      p.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&p.m_backend,(cpp_dec_float<50U,_int,_void> *)&local_68,
                 (cpp_dec_float<50U,_int,_void> *)
                 ((lp->
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .
                  super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._vptr_ClassArray + (ulong)*(uint *)(*plVar11 + 0x38 + lVar9) * 7));
      local_e8.m_backend.data._M_elems[7]._1_3_ = p.m_backend.data._M_elems[7]._1_3_;
      local_e8.m_backend.data._M_elems._24_5_ = p.m_backend.data._M_elems._24_5_;
      local_e8.m_backend.data._M_elems[0] = p.m_backend.data._M_elems[0];
      local_e8.m_backend.data._M_elems[1] = p.m_backend.data._M_elems[1];
      local_e8.m_backend.data._M_elems[2] = p.m_backend.data._M_elems[2];
      local_e8.m_backend.data._M_elems[3] = p.m_backend.data._M_elems[3];
      local_e8.m_backend.data._M_elems[4] = p.m_backend.data._M_elems[4];
      local_e8.m_backend.data._M_elems[5] = p.m_backend.data._M_elems[5];
      local_e8.m_backend.data._M_elems[9]._1_3_ = p.m_backend.data._M_elems[9]._1_3_;
      local_e8.m_backend.data._M_elems._32_5_ = p.m_backend.data._M_elems._32_5_;
      local_e8.m_backend.exp = p.m_backend.exp;
      local_e8.m_backend.neg = p.m_backend.neg;
      local_e8.m_backend.fpclass = p.m_backend.fpclass;
      local_e8.m_backend.prec_elem = p.m_backend.prec_elem;
      std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)&local_68,
                 (__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)(this + 0x1e0));
      eps = Tolerances::epsilon(local_68);
      bVar13 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                         (&local_e8,eps);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_60);
      arg = extraout_RDX_00;
      if (!bVar13) {
        tVar3 = boost::multiprecision::operator<
                          (&p,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)&local_168);
        if (tVar3) {
          local_168.data._M_elems[9]._1_3_ = p.m_backend.data._M_elems[9]._1_3_;
          local_168.data._M_elems._32_5_ = p.m_backend.data._M_elems._32_5_;
          local_168.data._M_elems[7]._1_3_ = p.m_backend.data._M_elems[7]._1_3_;
          local_168.data._M_elems._24_5_ = p.m_backend.data._M_elems._24_5_;
          local_168.data._M_elems[4] = p.m_backend.data._M_elems[4];
          local_168.data._M_elems[5] = p.m_backend.data._M_elems[5];
          local_168.data._M_elems[0] = p.m_backend.data._M_elems[0];
          local_168.data._M_elems[1] = p.m_backend.data._M_elems[1];
          local_168.data._M_elems[2] = p.m_backend.data._M_elems[2];
          local_168.data._M_elems[3] = p.m_backend.data._M_elems[3];
          local_168.exp = p.m_backend.exp;
          local_168.neg = p.m_backend.neg;
          local_168.fpclass = p.m_backend.fpclass;
          local_168.prec_elem = p.m_backend.prec_elem;
        }
        tVar3 = boost::multiprecision::operator>
                          (&p,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)&local_128);
        arg = extraout_RDX_01;
        if (tVar3) {
          local_128.data._M_elems[9]._1_3_ = p.m_backend.data._M_elems[9]._1_3_;
          local_128.data._M_elems._32_5_ = p.m_backend.data._M_elems._32_5_;
          local_128.data._M_elems[7]._1_3_ = p.m_backend.data._M_elems[7]._1_3_;
          local_128.data._M_elems._24_5_ = p.m_backend.data._M_elems._24_5_;
          local_128.data._M_elems[4] = p.m_backend.data._M_elems[4];
          local_128.data._M_elems[5] = p.m_backend.data._M_elems[5];
          local_128.data._M_elems[0] = p.m_backend.data._M_elems[0];
          local_128.data._M_elems[1] = p.m_backend.data._M_elems[1];
          local_128.data._M_elems[2] = p.m_backend.data._M_elems[2];
          local_128.data._M_elems[3] = p.m_backend.data._M_elems[3];
          local_128.exp = p.m_backend.exp;
          local_128.neg = p.m_backend.neg;
          local_128.fpclass = p.m_backend.fpclass;
          local_128.prec_elem = p.m_backend.prec_elem;
        }
      }
      lVar9 = lVar9 + 0x3c;
    }
    pdVar4 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              (&p.m_backend,*pdVar4,(type *)0x0);
    bVar13 = boost::multiprecision::operator==
                       ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)&local_168,&p);
    if (!bVar13) {
      p.m_backend.fpclass = cpp_dec_float_finite;
      p.m_backend.prec_elem = 10;
      p.m_backend.data._M_elems[0] = 0;
      p.m_backend.data._M_elems[1] = 0;
      p.m_backend.data._M_elems[2] = 0;
      p.m_backend.data._M_elems[3] = 0;
      p.m_backend.data._M_elems[4] = 0;
      p.m_backend.data._M_elems[5] = 0;
      p.m_backend.data._M_elems._24_5_ = 0;
      p.m_backend.data._M_elems[7]._1_3_ = 0;
      p.m_backend.data._M_elems._32_5_ = 0;
      p.m_backend.data._M_elems[9]._1_3_ = 0;
      p.m_backend.exp = 0;
      p.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&p.m_backend,&local_128,&local_168);
      tVar3 = boost::multiprecision::operator>(&p,__return_storage_ptr__);
      if (tVar3) {
        *(ulong *)((__return_storage_ptr__->m_backend).data._M_elems + 8) =
             CONCAT35(p.m_backend.data._M_elems[9]._1_3_,p.m_backend.data._M_elems._32_5_);
        *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 4) =
             p.m_backend.data._M_elems._16_8_;
        *(ulong *)((__return_storage_ptr__->m_backend).data._M_elems + 6) =
             CONCAT35(p.m_backend.data._M_elems[7]._1_3_,p.m_backend.data._M_elems._24_5_);
        *(undefined8 *)(__return_storage_ptr__->m_backend).data._M_elems =
             p.m_backend.data._M_elems._0_8_;
        *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 2) =
             p.m_backend.data._M_elems._8_8_;
        (__return_storage_ptr__->m_backend).exp = p.m_backend.exp;
        (__return_storage_ptr__->m_backend).neg = p.m_backend.neg;
        (__return_storage_ptr__->m_backend).fpclass = p.m_backend.fpclass;
        (__return_storage_ptr__->m_backend).prec_elem = p.m_backend.prec_elem;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static R maxPrescaledRatio(const SPxLPBase<R>& lp, const std::vector<R>& coScaleval, bool rowRatio)
{
   R pmax = 0.0;
   const int n = rowRatio ? lp.nRows() : lp.nCols();

   for(int i = 0; i < n; ++i)
   {
      const SVectorBase<R>& vec = rowRatio ? lp.rowVector(i) : lp.colVector(i);
      R mini = R(infinity);
      R maxi = 0.0;

      for(int j = 0; j < vec.size(); ++j)
      {
         assert(vec.index(j) >= 0);
         const R x = spxAbs(vec.value(j)) * coScaleval[unsigned(vec.index(j))];

         if(isZero(x, lp.tolerances()->epsilon()))
            continue;

         if(x < mini)
            mini = x;

         if(x > maxi)
            maxi = x;
      }

      if(mini == R(infinity))
         continue;

      const R p = maxi / mini;

      if(p > pmax)
         pmax = p;
   }

   return pmax;
}